

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O2

Split * __thiscall
embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,
          SetMB *set,size_t logBlockSize)

{
  BBox3fa *pBVar1;
  vuint4 *pvVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  Vec3fa VVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *pBVar15;
  char cVar16;
  runtime_error *this_00;
  long lVar17;
  ulong uVar18;
  long lVar19;
  BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *pBVar20;
  ulong uVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar23;
  uint uVar24;
  ulong uVar25;
  float fVar26;
  int iVar27;
  int iVar30;
  int iVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  Vec3fa VVar29;
  int iVar32;
  uint uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar36;
  undefined1 auVar37 [16];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  uint uVar42;
  uint uVar44;
  uint uVar45;
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  undefined1 auVar47 [16];
  uint uVar48;
  ulong uVar49;
  uint uVar52;
  uint uVar53;
  Vec3fa VVar50;
  undefined1 auVar51 [16];
  uint uVar54;
  float fVar55;
  uint uVar56;
  float fVar57;
  uint uVar58;
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar70;
  undefined1 auVar68 [16];
  BinMapping<32UL> mapping;
  ObjectBinner binner;
  task_group_context context;
  vfloat4 rAreas [32];
  undefined1 local_3790 [8];
  float fStack_3788;
  undefined1 local_3780 [16];
  undefined1 local_3770 [16];
  undefined1 local_3760 [16];
  undefined1 local_3750 [16];
  anon_class_8_1_b5464bae local_3740;
  PrimRefMB *local_3738;
  undefined1 local_3730 [16];
  undefined1 local_3720 [16];
  undefined1 local_3710 [16];
  anon_class_16_2_ed117de8_conflict16 local_3700;
  undefined1 local_36f0 [32];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_36d0;
  uint local_36c0;
  uint uStack_36bc;
  uint uStack_36b8;
  uint uStack_36b4;
  blocked_range<unsigned_long> local_36b0;
  undefined8 uStack_3698;
  anon_class_16_2_be24578a_conflict local_3690;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3680;
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [16];
  undefined1 local_35f0 [16];
  undefined1 local_35e0 [16];
  undefined1 local_35d0 [5972];
  int iStack_1e7c;
  undefined8 uStack_1e78;
  char acStack_1c90 [4];
  char acStack_1c8c [4];
  char acStack_1c88 [4];
  char acStack_1c84 [4];
  task_group_context local_1c80 [3];
  undefined8 uStack_1a90;
  float afStack_1a88 [2];
  undefined1 local_1a80 [20];
  float afStack_1a6c [1679];
  
  pBVar15 = (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
            (local_35d0 + 0x1750);
  pBVar20 = pBVar15;
  for (lVar17 = 0xb0; lVar17 != 0x18b0; lVar17 = lVar17 + 0xc0) {
    *(undefined8 *)((long)&local_36b0.my_end + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_36b0.my_begin + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_36b0.my_grainsize + lVar17) = 0xff800000ff800000;
    *(undefined8 *)((long)&uStack_3698 + lVar17) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_3690.prims + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_3690.mapping + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar17) = 0xff800000ff800000;
    *(undefined8 *)
     ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->
             _bounds[0][0].bounds0.lower.field_0 + lVar17 + 8) = 0xff800000ff800000;
    *(undefined8 *)(local_36f0 + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)(local_36f0 + lVar17 + 8) = 0x7f8000007f800000;
    *(undefined8 *)(local_36f0 + lVar17 + 0x10) = 0xff800000ff800000;
    *(undefined8 *)(local_36f0 + lVar17 + 0x18) = 0xff800000ff800000;
    *(undefined8 *)((long)&local_36d0 + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_36d0 + lVar17 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_36c0 + lVar17) = 0xff800000ff800000;
    *(undefined8 *)((long)&uStack_36b8 + lVar17) = 0xff800000ff800000;
    *(undefined8 *)(local_3730 + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)(local_3730 + lVar17 + 8) = 0x7f8000007f800000;
    *(undefined8 *)(local_3720 + lVar17) = 0xff800000ff800000;
    *(undefined8 *)(local_3720 + lVar17 + 8) = 0xff800000ff800000;
    *(undefined8 *)(local_3710 + lVar17) = 0x7f8000007f800000;
    *(undefined8 *)(local_3710 + lVar17 + 8) = 0x7f8000007f800000;
    *(undefined8 *)((long)&local_3700.reduction + lVar17) = 0xff800000ff800000;
    *(undefined8 *)(local_36f0 + lVar17 + -8) = 0xff800000ff800000;
    (((vuint4 *)pBVar20)->field_0).v[0] = 0;
    (((vuint4 *)pBVar20)->field_0).v[1] = 0;
    pBVar20 = (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
              ((long)pBVar20 + 0x10);
  }
  uVar12 = (set->super_PrimInfoMB).object_range._begin;
  uVar13 = (set->super_PrimInfoMB).object_range._end;
  uVar18 = uVar13 - uVar12;
  local_3750._8_8_ = 0x7f8000007f800000;
  local_3750._0_8_ = 0x7f8000007f800000;
  local_3760._8_8_ = 0xff800000ff800000;
  local_3760._0_8_ = 0xff800000ff800000;
  fVar26 = (float)uVar18 * 0.05 + 4.0;
  uVar21 = (ulong)fVar26;
  uVar21 = (long)(fVar26 - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21;
  local_36f0._0_8_ = 0x20;
  if (uVar21 < 0x20) {
    local_36f0._0_8_ = uVar21;
  }
  pBVar1 = &(set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds;
  local_36f0._16_4_ = (pBVar1->lower).field_0.m128[0];
  local_36f0._20_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[1];
  local_36f0._24_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[2];
  local_36f0._28_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[3];
  auVar34 = *(undefined1 (*) [16])(pBVar1->lower).field_0.m128;
  auVar33._0_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[0] - (float)local_36f0._16_4_;
  auVar33._4_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[1] - (float)local_36f0._20_4_;
  auVar33._8_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[2] - (float)local_36f0._24_4_;
  auVar33._12_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[3] - (float)local_36f0._28_4_;
  auVar33 = maxps(_DAT_01f46b30,auVar33);
  auVar37._0_4_ = (float)(long)local_36f0._0_8_ * 0.99;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar37 = divps(auVar37,auVar33);
  local_36d0.i[0] = -(uint)((float)DAT_01f46b30 < auVar33._0_4_) & auVar37._0_4_;
  local_36d0.i[1] = -(uint)(DAT_01f46b30._4_4_ < auVar33._4_4_) & auVar37._4_4_;
  local_36d0.i[2] = -(uint)(DAT_01f46b30._8_4_ < auVar33._8_4_) & auVar37._8_4_;
  local_36d0.i[3] = -(uint)(DAT_01f46b30._12_4_ < auVar33._12_4_) & auVar37._12_4_;
  local_3738 = set->prims->items;
  if (uVar18 < 0xc00) {
    if (uVar13 != uVar12) {
      local_3738 = local_3738 + uVar12;
      uVar24 = (int)local_36f0._0_8_ - 1;
      uVar21 = 0;
      while( true ) {
        local_3790._0_4_ = auVar34._0_4_;
        local_3790._4_4_ = auVar34._4_4_;
        fStack_3788 = auVar34._8_4_;
        if (uVar18 - 1 <= uVar21) break;
        aVar3 = (local_3738->lbounds).bounds0.lower.field_0.field_1;
        aVar4 = (local_3738->lbounds).bounds0.upper.field_0.field_1;
        aVar5 = (local_3738->lbounds).bounds1.lower.field_0.field_1;
        aVar6 = (local_3738->lbounds).bounds1.upper.field_0.field_1;
        uVar38 = (uint)(((aVar4.x * 0.5 + aVar6.x * 0.5 + aVar3.x * 0.5 + aVar5.x * 0.5) -
                        (float)local_3790._0_4_) * local_36d0.v[0] + -0.5);
        uVar39 = (uint)(((aVar4.y * 0.5 + aVar6.y * 0.5 + aVar3.y * 0.5 + aVar5.y * 0.5) -
                        (float)local_3790._4_4_) * local_36d0.v[1] + -0.5);
        uVar40 = (uint)(((aVar4.z * 0.5 + aVar6.z * 0.5 + aVar3.z * 0.5 + aVar5.z * 0.5) -
                        fStack_3788) * local_36d0.v[2] + -0.5);
        uVar42 = -(uint)((int)uVar24 < (int)uVar38);
        uVar44 = -(uint)((int)uVar24 < (int)uVar39);
        uVar45 = -(uint)((int)uVar24 < (int)uVar40);
        uVar38 = ~uVar42 & uVar38 | uVar24 & uVar42;
        uVar39 = ~uVar44 & uVar39 | uVar24 & uVar44;
        uVar40 = ~uVar45 & uVar40 | uVar24 & uVar45;
        aVar7 = local_3738[1].lbounds.bounds0.lower.field_0.field_1;
        aVar8 = local_3738[1].lbounds.bounds0.upper.field_0.field_1;
        aVar9 = local_3738[1].lbounds.bounds1.lower.field_0.field_1;
        aVar10 = local_3738[1].lbounds.bounds1.upper.field_0.field_1;
        uVar42 = (uint)(((aVar8.x * 0.5 + aVar10.x * 0.5 + aVar7.x * 0.5 + aVar9.x * 0.5) -
                        (float)local_3790._0_4_) * local_36d0.v[0] + -0.5);
        uVar44 = (uint)(((aVar8.y * 0.5 + aVar10.y * 0.5 + aVar7.y * 0.5 + aVar9.y * 0.5) -
                        (float)local_3790._4_4_) * local_36d0.v[1] + -0.5);
        uVar45 = (uint)(((aVar8.z * 0.5 + aVar10.z * 0.5 + aVar7.z * 0.5 + aVar9.z * 0.5) -
                        fStack_3788) * local_36d0.v[2] + -0.5);
        uVar48 = -(uint)((int)uVar24 < (int)uVar42);
        uVar52 = -(uint)((int)uVar24 < (int)uVar44);
        uVar53 = -(uint)((int)uVar24 < (int)uVar45);
        uVar42 = ~uVar48 & uVar42 | uVar24 & uVar48;
        uVar44 = ~uVar52 & uVar44 | uVar24 & uVar52;
        uVar45 = ~uVar53 & uVar45 | uVar24 & uVar53;
        uVar25 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar25 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0);
        aVar46.m128 = (__m128)minps(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                      *)&local_3680)->_bounds[uVar25][0].bounds0.lower.field_0,
                                    (undefined1  [16])aVar3);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [uVar25][0].bounds0.lower.field_0 = aVar46;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar25 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0) = VVar50.field_0;
        uVar49 = (ulong)(-(uint)(0 < (int)uVar39) & uVar39);
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar49 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0);
        VVar29.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar49 * 0xc0),
                   (undefined1  [16])aVar3);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar49 * 0xc0) = VVar29.field_0;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar49 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0) = VVar50.field_0;
        uVar14 = (ulong)(-(uint)(0 < (int)uVar40) & uVar40);
        lVar17 = uVar14 * 0xc0;
        auVar33 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970);
        auVar37 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960);
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar14 * 0xc0),
                   (undefined1  [16])aVar3);
        auVar43 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar14 * 0xc0) = VVar50.field_0;
        auVar33 = maxps(auVar33,(undefined1  [16])aVar4);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970) = auVar33;
        auVar33 = minps(auVar37,(undefined1  [16])aVar5);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960) = auVar33;
        auVar33 = maxps(auVar43,(undefined1  [16])aVar6);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950) = auVar33;
        iVar27 = *(int *)((long)&(local_3738->lbounds).bounds1.lower.field_0 + 0xc);
        pvVar2 = (vuint4 *)(&pBVar15->_bounds[0][0].bounds0.lower + uVar25);
        (pvVar2->field_0).i[0] = (pvVar2->field_0).i[0] + iVar27;
        *(uint *)&((vuint4 *)(&iStack_1e7c + uVar49 * 4))->field_0 =
             *(uint *)&((vuint4 *)(&iStack_1e7c + uVar49 * 4))->field_0 + iVar27;
        *(uint *)&((vuint4 *)(&uStack_1e78 + uVar14 * 2))->field_0 =
             *(uint *)&((vuint4 *)(&uStack_1e78 + uVar14 * 2))->field_0 + iVar27;
        uVar25 = (ulong)(-(uint)(0 < (int)uVar42) & uVar42);
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar25 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0);
        aVar46.m128 = (__m128)minps(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                      *)&local_3680)->_bounds[uVar25][0].bounds0.lower.field_0,
                                    (undefined1  [16])aVar7);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [uVar25][0].bounds0.lower.field_0 = aVar46;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar8);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar25 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar9);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar10);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar25 * 0xc0) = VVar50.field_0;
        uVar49 = (ulong)(-(uint)(0 < (int)uVar44) & uVar44);
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar49 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0);
        VVar29.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar49 * 0xc0),
                   (undefined1  [16])aVar7);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar49 * 0xc0) = VVar29.field_0;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar8);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar49 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar9);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar10);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar49 * 0xc0) = VVar50.field_0;
        uVar14 = (ulong)(-(uint)(0 < (int)uVar45) & uVar45);
        lVar17 = uVar14 * 0xc0;
        auVar33 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970);
        auVar37 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960);
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar14 * 0xc0),
                   (undefined1  [16])aVar7);
        auVar43 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar14 * 0xc0) = VVar50.field_0;
        auVar33 = maxps(auVar33,(undefined1  [16])aVar8);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970) = auVar33;
        auVar33 = minps(auVar37,(undefined1  [16])aVar9);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960) = auVar33;
        auVar33 = maxps(auVar43,(undefined1  [16])aVar10);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950) = auVar33;
        iVar27 = *(int *)((long)&local_3738[1].lbounds.bounds1.lower.field_0 + 0xc);
        pvVar2 = (vuint4 *)(&pBVar15->_bounds[0][0].bounds0.lower + uVar25);
        (pvVar2->field_0).i[0] = (pvVar2->field_0).i[0] + iVar27;
        *(uint *)&((vuint4 *)(&iStack_1e7c + uVar49 * 4))->field_0 =
             *(uint *)&((vuint4 *)(&iStack_1e7c + uVar49 * 4))->field_0 + iVar27;
        *(uint *)&((vuint4 *)(&uStack_1e78 + uVar14 * 2))->field_0 =
             *(uint *)&((vuint4 *)(&uStack_1e78 + uVar14 * 2))->field_0 + iVar27;
        uVar21 = uVar21 + 2;
        local_3738 = local_3738 + 2;
      }
      if (uVar21 < uVar18) {
        aVar3 = (local_3738->lbounds).bounds0.lower.field_0.field_1;
        aVar4 = (local_3738->lbounds).bounds0.upper.field_0.field_1;
        aVar5 = (local_3738->lbounds).bounds1.lower.field_0.field_1;
        aVar6 = (local_3738->lbounds).bounds1.upper.field_0.field_1;
        uVar38 = (uint)(local_36d0.v[0] *
                        ((aVar4.x * 0.5 + aVar6.x * 0.5 + aVar3.x * 0.5 + aVar5.x * 0.5) -
                        (float)local_3790._0_4_) + -0.5);
        uVar39 = (uint)(local_36d0.v[1] *
                        ((aVar4.y * 0.5 + aVar6.y * 0.5 + aVar3.y * 0.5 + aVar5.y * 0.5) -
                        (float)local_3790._4_4_) + -0.5);
        uVar40 = (uint)(local_36d0.v[2] *
                        ((aVar4.z * 0.5 + aVar6.z * 0.5 + aVar3.z * 0.5 + aVar5.z * 0.5) -
                        fStack_3788) + -0.5);
        uVar42 = -(uint)((int)uVar24 < (int)uVar38);
        uVar44 = -(uint)((int)uVar24 < (int)uVar39);
        uVar45 = -(uint)((int)uVar24 < (int)uVar40);
        uVar38 = ~uVar42 & uVar38 | uVar24 & uVar42;
        uVar39 = ~uVar44 & uVar39 | uVar24 & uVar44;
        uVar24 = ~uVar45 & uVar40 | uVar24 & uVar45;
        iVar27 = *(int *)((long)&(local_3738->lbounds).bounds1.lower.field_0 + 0xc);
        uVar18 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
        pvVar2 = (vuint4 *)(&pBVar15->_bounds[0][0].bounds0.lower + uVar18);
        (pvVar2->field_0).i[0] = (pvVar2->field_0).i[0] + iVar27;
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar18 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar18 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar18 * 0xc0);
        aVar46.m128 = (__m128)minps(((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                      *)&local_3680)->_bounds[uVar18][0].bounds0.lower.field_0,
                                    (undefined1  [16])aVar3);
        ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680)->_bounds
        [uVar18][0].bounds0.lower.field_0 = aVar46;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3670 + uVar18 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar18 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3650 + uVar18 * 0xc0) = VVar50.field_0;
        uVar18 = (ulong)(-(uint)(0 < (int)uVar39) & uVar39);
        *(uint *)&((vuint4 *)(&iStack_1e7c + uVar18 * 4))->field_0 =
             *(uint *)&((vuint4 *)(&iStack_1e7c + uVar18 * 4))->field_0 + iVar27;
        VVar50.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar18 * 0xc0);
        aVar28 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar18 * 0xc0 + 0xfffffffffffffff0);
        VVar11.field_0 =
             *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
              *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar18 * 0xc0);
        VVar29.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar18 * 0xc0),
                   (undefined1  [16])aVar3);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3640 + uVar18 * 0xc0) = VVar29.field_0;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar50.field_0,(undefined1  [16])aVar4);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3630 + uVar18 * 0xc0) = VVar50.field_0;
        aVar28.m128 = (__m128)minps(aVar28.m128,(undefined1  [16])aVar5);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar18 * 0xc0 + 0xfffffffffffffff0) = aVar28;
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             maxps((undefined1  [16])VVar11.field_0,(undefined1  [16])aVar6);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3610 + uVar18 * 0xc0) = VVar50.field_0;
        uVar18 = (ulong)(-(uint)(0 < (int)uVar24) & uVar24);
        lVar17 = uVar18 * 0xc0;
        *(uint *)&((vuint4 *)(&uStack_1e78 + uVar18 * 2))->field_0 =
             *(uint *)&((vuint4 *)(&uStack_1e78 + uVar18 * 2))->field_0 + iVar27;
        auVar34 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970);
        auVar33 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960);
        auVar37 = *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950);
        VVar50.field_0 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0)
             minps((undefined1  [16])
                   *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                    *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar18 * 0xc0),
                   (undefined1  [16])aVar3);
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
         *(LBBox<embree::Vec3fa> (*) [3])(local_3600 + uVar18 * 0xc0) = VVar50.field_0;
        auVar34 = maxps(auVar34,(undefined1  [16])aVar4);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1970) = auVar34;
        auVar34 = minps(auVar33,(undefined1  [16])aVar5);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1960) = auVar34;
        auVar34 = maxps(auVar37,(undefined1  [16])aVar6);
        *(undefined1 (*) [16])((long)local_1c80 + lVar17 + -0x1950) = auVar34;
      }
    }
  }
  else {
    local_3690.prims = &local_3738;
    local_3740.mapping = (BinMapping<32UL> *)local_36f0;
    local_3690.mapping = local_3740.mapping;
    tbb::detail::d1::task_group_context::task_group_context
              (local_1c80,(context_traits)0x4,CUSTOM_CTX);
    local_36b0.my_begin = uVar12;
    local_36b0.my_end = uVar13;
    local_36b0.my_grainsize = 0x400;
    local_3700.reduction = &local_3740;
    local_3700.func = &local_3690;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:513:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80,
               &local_36b0,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680,
               &local_3700,local_3700.reduction,local_1c80);
    cVar16 = tbb::detail::r1::is_group_execution_cancelled(local_1c80);
    if (cVar16 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(local_1c80);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)&local_3680,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80);
  }
  lVar19 = local_36f0._0_8_ * 0xc0 + -0x10;
  lVar17 = local_36f0._0_8_ * 0x10 + 0x17f0;
  iVar27 = 0;
  iVar30 = 0;
  iVar31 = 0;
  iVar32 = 0;
  _local_3790 = _DAT_01f45a30;
  auVar34 = _DAT_01f45a40;
  auVar33 = _DAT_01f45a40;
  auVar37 = _DAT_01f45a40;
  auVar43 = _DAT_01f45a30;
  auVar47 = _DAT_01f45a40;
  auVar51 = _DAT_01f45a30;
  auVar60 = _DAT_01f45a30;
  auVar61 = _DAT_01f45a40;
  auVar68 = _DAT_01f45a30;
  lVar22 = local_36f0._0_8_ * 0x10;
  for (uVar18 = 1; local_36f0._0_8_ != uVar18; uVar18 = uVar18 + 1) {
    auVar51 = minps(auVar51,*(undefined1 (*) [16])(local_3730 + lVar19));
    auVar33 = maxps(auVar33,*(undefined1 (*) [16])(local_3720 + lVar19));
    auVar60 = minps(auVar60,*(undefined1 (*) [16])(local_3710 + lVar19));
    auVar61 = maxps(auVar61,*(undefined1 (*) [16])((long)&local_3700.reduction + lVar19));
    fVar55 = auVar33._4_4_ - auVar51._4_4_;
    fVar57 = auVar33._8_4_ - auVar51._8_4_;
    fVar62 = auVar61._4_4_ - auVar60._4_4_;
    fVar64 = auVar61._8_4_ - auVar60._8_4_;
    _local_3790 = minps(_local_3790,*(undefined1 (*) [16])(local_36f0 + lVar19));
    auVar34 = maxps(auVar34,*(undefined1 (*) [16])(local_36f0 + lVar19 + 0x10));
    auVar43 = minps(auVar43,*(undefined1 (*) [16])((long)&local_36d0 + lVar19));
    auVar47 = maxps(auVar47,*(undefined1 (*) [16])((long)&local_36c0 + lVar19));
    fVar26 = auVar34._4_4_ - local_3790._4_4_;
    fVar41 = auVar34._8_4_ - local_3790._8_4_;
    fVar69 = auVar47._4_4_ - auVar43._4_4_;
    fVar70 = auVar47._8_4_ - auVar43._8_4_;
    local_3750 = minps(local_3750,*(undefined1 (*) [16])((long)&local_36b0.my_end + lVar19));
    local_3760 = maxps(local_3760,*(undefined1 (*) [16])((long)&local_36b0.my_grainsize + lVar19));
    auVar68 = minps(auVar68,*(undefined1 (*) [16])((long)&local_3690.prims + lVar19));
    auVar37 = maxps(auVar37,*(undefined1 (*) [16])
                             ((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                       *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 + lVar19)
                   );
    *(ulong *)((long)&uStack_1a90 + lVar22) =
         CONCAT44(((auVar47._0_4_ - auVar43._0_4_) * (fVar69 + fVar70) + fVar70 * fVar69 +
                  (auVar34._0_4_ - local_3790._0_4_) * (fVar26 + fVar41) + fVar41 * fVar26) * 0.5,
                  ((auVar61._0_4_ - auVar60._0_4_) * (fVar62 + fVar64) + fVar64 * fVar62 +
                  (auVar33._0_4_ - auVar51._0_4_) * (fVar55 + fVar57) + fVar57 * fVar55) * 0.5);
    fVar26 = local_3760._4_4_ - local_3750._4_4_;
    fVar55 = local_3760._8_4_ - local_3750._8_4_;
    fVar41 = auVar37._4_4_ - auVar68._4_4_;
    fVar57 = auVar37._8_4_ - auVar68._8_4_;
    *(float *)((long)afStack_1a88 + lVar22) =
         ((fVar41 + fVar57) * (auVar37._0_4_ - auVar68._0_4_) + fVar57 * fVar41 +
         (fVar26 + fVar55) * (local_3760._0_4_ - local_3750._0_4_) + fVar55 * fVar26) * 0.5;
    iVar27 = iVar27 + *(int *)((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                        *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 + lVar17
                              );
    iVar30 = iVar30 + *(int *)((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                        *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 +
                              lVar17 + 4);
    iVar31 = iVar31 + *(int *)((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                        *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 +
                              lVar17 + 8);
    iVar32 = iVar32 + *(int *)((long)&((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>
                                        *)&local_3680)->_bounds[0][0].bounds0.lower.field_0 +
                              lVar17 + 0xc);
    *(int *)(local_1c80[0].padding + lVar22 + -0x58) = iVar27;
    *(int *)(local_1c80[0].padding + lVar22 + -0x54) = iVar30;
    *(int *)(local_1c80[0].padding + lVar22 + -0x50) = iVar31;
    *(int *)(local_1c80[0].padding + lVar22 + -0x4c) = iVar32;
    *(undefined4 *)((long)afStack_1a88 + lVar22 + 4) = 0;
    lVar19 = lVar19 + -0xc0;
    lVar17 = lVar17 + -0x10;
    lVar22 = lVar22 + -0x10;
  }
  uVar18 = 0xffffffffffffffff;
  local_36c0 = ~(-1 << ((byte)logBlockSize & 0x1f));
  uStack_36bc = local_36c0;
  uStack_36b8 = local_36c0;
  uStack_36b4 = local_36c0;
  uVar24 = 1;
  uVar38 = 1;
  uVar39 = 1;
  uVar40 = 1;
  uVar42 = 0;
  uVar44 = 0;
  uVar45 = 0;
  uVar48 = 0;
  paVar23 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_35d0;
  lVar17 = 0;
  local_3760 = _DAT_01f45a30;
  _local_3790 = _DAT_01f45a30;
  local_3770 = _DAT_01f45a40;
  local_3780 = _DAT_01f45a30;
  local_3710 = _DAT_01f45a40;
  local_3720 = _DAT_01f45a30;
  local_3730 = _DAT_01f45a40;
  local_3750 = _DAT_01f45a40;
  iVar27 = 0;
  iVar30 = 0;
  iVar31 = 0;
  iVar32 = 0;
  auVar34 = _DAT_01f45a40;
  auVar33 = _DAT_01f45a30;
  auVar37 = _DAT_01f45a30;
  auVar43 = _DAT_01f45a40;
  auVar47 = _DAT_01f45a30;
  for (uVar21 = 1; uVar21 < (ulong)local_36f0._0_8_; uVar21 = uVar21 + 1) {
    auVar33 = minps(auVar33,(undefined1  [16])paVar23[-0xb]);
    auVar34 = maxps(auVar34,(undefined1  [16])paVar23[-10]);
    auVar37 = minps(auVar37,(undefined1  [16])paVar23[-9]);
    auVar43 = maxps(auVar43,(undefined1  [16])paVar23[-8]);
    fVar26 = auVar34._4_4_ - auVar33._4_4_;
    fVar41 = auVar34._8_4_ - auVar33._8_4_;
    fVar62 = auVar43._4_4_ - auVar37._4_4_;
    fVar64 = auVar43._8_4_ - auVar37._8_4_;
    local_3780 = minps(local_3780,(undefined1  [16])paVar23[-7]);
    local_3710 = maxps(local_3710,(undefined1  [16])paVar23[-6]);
    local_3720 = minps(local_3720,(undefined1  [16])paVar23[-5]);
    local_3730 = maxps(local_3730,(undefined1  [16])paVar23[-4]);
    fVar63 = local_3710._4_4_ - local_3780._4_4_;
    fVar65 = local_3710._8_4_ - local_3780._8_4_;
    fVar69 = local_3730._4_4_ - local_3720._4_4_;
    fVar70 = local_3730._8_4_ - local_3720._8_4_;
    local_3760 = minps(local_3760,(undefined1  [16])paVar23[-3]);
    local_3750 = maxps(local_3750,(undefined1  [16])paVar23[-2]);
    _local_3790 = minps(_local_3790,(undefined1  [16])paVar23[-1]);
    local_3770 = maxps(local_3770,(undefined1  [16])*paVar23);
    fVar66 = local_3750._4_4_ - local_3760._4_4_;
    fVar67 = local_3750._8_4_ - local_3760._8_4_;
    fVar55 = local_3770._4_4_ - local_3790._4_4_;
    fVar57 = local_3770._8_4_ - local_3790._8_4_;
    iVar27 = iVar27 + *(int *)(local_35d0 + lVar17 + 0x1750);
    iVar30 = iVar30 + *(int *)((long)&iStack_1e7c + lVar17);
    iVar31 = iVar31 + *(int *)((long)&uStack_1e78 + lVar17);
    iVar32 = iVar32 + *(int *)((long)&uStack_1e78 + lVar17 + 4U);
    fVar55 = (local_3770._0_4_ - local_3790._0_4_) * (fVar55 + fVar57) + fVar57 * fVar55;
    fVar57 = (local_3750._0_4_ - local_3760._0_4_) * (fVar66 + fVar67) + fVar67 * fVar66;
    uVar49 = logBlockSize & 0xffffffff;
    uVar52 = iVar27 + local_36c0 >> uVar49;
    uVar53 = iVar30 + local_36c0 >> uVar49;
    uVar35 = iVar31 + local_36c0 >> uVar49;
    uVar36 = iVar32 + local_36c0 >> uVar49;
    uVar54 = *(int *)(local_1c80[0].padding + lVar17 + -0x38) + local_36c0 >> uVar49;
    uVar56 = *(int *)(local_1c80[0].padding + lVar17 + -0x34) + local_36c0 >> uVar49;
    uVar58 = *(int *)(local_1c80[0].padding + lVar17 + -0x30) + local_36c0 >> uVar49;
    uVar59 = *(int *)(local_1c80[0].padding + lVar17 + -0x2c) + local_36c0 >> uVar49;
    auVar51._0_4_ =
         ((float)(uVar54 & 0x7fffffff) + (float)((int)uVar54 >> 0x1f & 0x4f000000)) *
         *(float *)(local_1a80 + lVar17 + 0x10) +
         ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
         ((auVar43._0_4_ - auVar37._0_4_) * (fVar62 + fVar64) + fVar64 * fVar62 +
         (auVar34._0_4_ - auVar33._0_4_) * (fVar26 + fVar41) + fVar41 * fVar26) * 0.5;
    auVar51._4_4_ =
         ((float)(uVar56 & 0x7fffffff) + (float)((int)uVar56 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_1a6c + lVar17) +
         ((float)(uVar53 & 0x7fffffff) + (float)((int)uVar53 >> 0x1f & 0x4f000000)) *
         ((local_3730._0_4_ - local_3720._0_4_) * (fVar69 + fVar70) + fVar70 * fVar69 +
         (local_3710._0_4_ - local_3780._0_4_) * (fVar63 + fVar65) + fVar65 * fVar63) * 0.5;
    auVar51._8_4_ =
         ((float)(uVar58 & 0x7fffffff) + (float)((int)uVar58 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_1a6c + lVar17 + 4) +
         ((float)(uVar35 & 0x7fffffff) + (float)((int)uVar35 >> 0x1f & 0x4f000000)) *
         (fVar57 + fVar55) * 0.5;
    auVar51._12_4_ =
         ((float)(uVar59 & 0x7fffffff) + (float)((int)uVar59 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_1a6c + lVar17 + 8) +
         ((float)(uVar36 & 0x7fffffff) + (float)((int)uVar36 >> 0x1f & 0x4f000000)) *
         (fVar55 + fVar57) * 0.5;
    uVar52 = -(uint)(auVar47._0_4_ <= auVar51._0_4_);
    uVar53 = -(uint)(auVar47._4_4_ <= auVar51._4_4_);
    uVar35 = -(uint)(auVar47._8_4_ <= auVar51._8_4_);
    uVar36 = -(uint)(auVar47._12_4_ <= auVar51._12_4_);
    uVar42 = uVar42 & uVar52 | ~uVar52 & uVar24;
    uVar44 = uVar44 & uVar53 | ~uVar53 & uVar38;
    uVar45 = uVar45 & uVar35 | ~uVar35 & uVar39;
    uVar48 = uVar48 & uVar36 | ~uVar36 & uVar40;
    auVar47 = minps(auVar51,auVar47);
    uVar24 = uVar24 + 1;
    uVar38 = uVar38 + 1;
    uVar39 = uVar39 + 1;
    uVar40 = uVar40 + 1;
    lVar17 = lVar17 + 0x10;
    paVar23 = paVar23 + 0xc;
  }
  local_36b0.my_end = auVar47._0_8_;
  local_36b0.my_begin = auVar47._8_8_;
  local_3700.reduction = (anon_class_8_1_b5464bae *)CONCAT44(uVar44,uVar42);
  local_3700.func = (anon_class_16_2_be24578a_conflict *)CONCAT44(uVar48,uVar45);
  fVar26 = INFINITY;
  iVar27 = 0;
  for (uVar21 = 0; uVar21 != 3; uVar21 = uVar21 + 1) {
    if ((((local_36d0.v[uVar21] != 0.0) || (NAN(local_36d0.v[uVar21]))) &&
        (fVar41 = *(float *)((long)&local_36b0.my_end + uVar21 * 4), fVar41 < fVar26)) &&
       (iVar30 = *(int *)((long)&local_3700.reduction + uVar21 * 4), iVar30 != 0)) {
      uVar18 = uVar21 & 0xffffffff;
      iVar27 = iVar30;
      fVar26 = fVar41;
    }
  }
  __return_storage_ptr__->dim = (int)uVar18;
  (__return_storage_ptr__->field_2).pos = iVar27;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_36f0._0_8_;
  *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 =
       CONCAT44(local_36f0._20_4_,local_36f0._16_4_);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
       CONCAT44(local_36f0._28_4_,local_36f0._24_4_);
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 =
       CONCAT44(local_36d0.i[1],local_36d0.i[0]);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(local_36d0.i[3],local_36d0.i[2]);
  __return_storage_ptr__->sah =
       fVar26 * ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower
                );
  if ((int)uVar18 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }